

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O1

void Pf_CutParams(Pf_Man_t *p,Pf_Cut_t *pCut,int nGiaRefs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  
  uVar1 = *(uint *)&pCut->field_0x10;
  uVar5 = uVar1 >> 0x1b;
  pJVar4 = p->pPars;
  if (pJVar4->nLutSize < (int)uVar5) {
    __assert_fail("nLeaves <= p->pPars->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                  ,0x2fe,"void Pf_CutParams(Pf_Man_t *, Pf_Cut_t *, int)");
  }
  pCut->Delay = 0;
  pCut->Flow = 0.0;
  if (0x7ffffff < uVar1) {
    iVar6 = pCut->Delay;
    uVar7 = 0;
    do {
      iVar2 = pCut->pLeaves[uVar7];
      lVar8 = (long)iVar2;
      if ((lVar8 < 0) || ((p->vCutDelays).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vCutDelays).pArray[lVar8];
      if (iVar6 <= iVar3) {
        iVar6 = iVar3;
      }
      pCut->Delay = iVar6;
      if ((p->vCutFlows).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      pCut->Flow = (p->vCutFlows).pArray[lVar8] + pCut->Flow;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  pCut->Delay = (pCut->Delay + 1) - (uint)(uVar1 < 0x10000000);
  fVar9 = 0.0;
  if (0xfffffff < uVar1) {
    fVar9 = (float)(int)(uVar5 + pJVar4->nAreaTuner);
  }
  pCut->Flow = (pCut->Flow + fVar9) / (float)(int)(nGiaRefs + (uint)(nGiaRefs == 0));
  return;
}

Assistant:

static inline void Pf_CutParams( Pf_Man_t * p, Pf_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Pf_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Pf_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + Pf_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}